

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

FT_Fixed psh_hint_snap_stem_side_delta(FT_Fixed pos,FT_Fixed len)

{
  long lVar1;
  long local_48;
  long local_38;
  FT_Fixed delta2;
  FT_Fixed delta1;
  FT_Fixed len_local;
  FT_Fixed pos_local;
  
  lVar1 = (pos + 0x20U & 0xffffffffffffffc0) - pos;
  pos_local = ((pos + len + 0x20U & 0xffffffffffffffc0) - pos) - len;
  local_38 = lVar1;
  if (lVar1 < 0) {
    local_38 = -lVar1;
  }
  local_48 = pos_local;
  if (pos_local < 0) {
    local_48 = -pos_local;
  }
  if (local_38 <= local_48) {
    pos_local = lVar1;
  }
  return pos_local;
}

Assistant:

static FT_Fixed
  psh_hint_snap_stem_side_delta( FT_Fixed  pos,
                                 FT_Fixed  len )
  {
    FT_Fixed  delta1 = FT_PIX_ROUND( pos ) - pos;
    FT_Fixed  delta2 = FT_PIX_ROUND( pos + len ) - pos - len;


    if ( FT_ABS( delta1 ) <= FT_ABS( delta2 ) )
      return delta1;
    else
      return delta2;
  }